

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool wallet::LoadEncryptionKey
               (CWallet *pwallet,DataStream *ssKey,DataStream *ssValue,string *strErr)

{
  size_type sVar1;
  mapped_type *this;
  long in_FS_OFFSET;
  CMasterKey kMasterKey;
  uint nID;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  CMasterKey CStack_b8;
  uint32_t local_64;
  unique_lock<std::recursive_mutex> local_60;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_60,&pwallet->cs_wallet,
             "pwallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp"
             ,0x1a7,false);
  local_64 = ser_readdata32<DataStream>(ssKey);
  CMasterKey::CMasterKey(&CStack_b8);
  CMasterKey::SerializationOps<DataStream,wallet::CMasterKey,ActionUnserialize>(&CStack_b8,ssValue);
  sVar1 = std::
          map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
          ::count(&pwallet->mapMasterKeys,&local_64);
  if (sVar1 == 0) {
    this = std::
           map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
           ::operator[](&pwallet->mapMasterKeys,&local_64);
    CMasterKey::operator=(this,&CStack_b8);
    if (pwallet->nMasterKeyMaxID < local_64) {
      pwallet->nMasterKeyMaxID = local_64;
    }
  }
  else {
    tinyformat::format<unsigned_int>
              (&local_50,"Error reading wallet database: duplicate CMasterKey id %u",&local_64);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (strErr,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  CMasterKey::~CMasterKey(&CStack_b8);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return sVar1 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool LoadEncryptionKey(CWallet* pwallet, DataStream& ssKey, DataStream& ssValue, std::string& strErr)
{
    LOCK(pwallet->cs_wallet);
    try {
        // Master encryption key is loaded into only the wallet and not any of the ScriptPubKeyMans.
        unsigned int nID;
        ssKey >> nID;
        CMasterKey kMasterKey;
        ssValue >> kMasterKey;
        if(pwallet->mapMasterKeys.count(nID) != 0)
        {
            strErr = strprintf("Error reading wallet database: duplicate CMasterKey id %u", nID);
            return false;
        }
        pwallet->mapMasterKeys[nID] = kMasterKey;
        if (pwallet->nMasterKeyMaxID < nID)
            pwallet->nMasterKeyMaxID = nID;

    } catch (const std::exception& e) {
        if (strErr.empty()) {
            strErr = e.what();
        }
        return false;
    }
    return true;
}